

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

bool __thiscall Matrix::lu(Matrix *this,int32_t *idx,FLOAT *d,FLOAT eps)

{
  FLOAT FVar1;
  ostream *poVar2;
  void *__ptr;
  double dVar3;
  FLOAT *vv;
  FLOAT temp;
  FLOAT sum;
  FLOAT dum;
  FLOAT big;
  int32_t k;
  int32_t j;
  int32_t imax;
  int32_t i;
  FLOAT eps_local;
  FLOAT *d_local;
  int32_t *idx_local;
  Matrix *this_local;
  
  if (this->m != this->n) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "ERROR: Trying to LU decompose a matrix of size (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m);
    poVar2 = std::operator<<(poVar2,"x");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->n);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  __ptr = malloc((long)this->n << 3);
  *d = 1.0;
  j = 0;
  while( true ) {
    if (this->n <= j) {
      for (big._4_4_ = 0; big._4_4_ < this->n; big._4_4_ = big._4_4_ + 1) {
        for (j = 0; j < big._4_4_; j = j + 1) {
          temp = this->val[j][big._4_4_];
          for (big._0_4_ = 0; big._0_4_ < j; big._0_4_ = big._0_4_ + 1) {
            temp = -this->val[j][big._0_4_] * this->val[big._0_4_][big._4_4_] + temp;
          }
          this->val[j][big._4_4_] = temp;
        }
        dum = 0.0;
        for (j = big._4_4_; j < this->n; j = j + 1) {
          temp = this->val[j][big._4_4_];
          for (big._0_4_ = 0; big._0_4_ < big._4_4_; big._0_4_ = big._0_4_ + 1) {
            temp = -this->val[j][big._0_4_] * this->val[big._0_4_][big._4_4_] + temp;
          }
          this->val[j][big._4_4_] = temp;
          dVar3 = *(double *)((long)__ptr + (long)j * 8) * ABS(temp);
          if (dum <= dVar3) {
            k = j;
            dum = dVar3;
          }
        }
        if (big._4_4_ != k) {
          for (big._0_4_ = 0; big._0_4_ < this->n; big._0_4_ = big._0_4_ + 1) {
            FVar1 = this->val[k][big._0_4_];
            this->val[k][big._0_4_] = this->val[big._4_4_][big._0_4_];
            this->val[big._4_4_][big._0_4_] = FVar1;
          }
          *d = -*d;
          *(undefined8 *)((long)__ptr + (long)k * 8) =
               *(undefined8 *)((long)__ptr + (long)big._4_4_ * 8);
        }
        idx[big._4_4_] = k;
        if (big._4_4_ != this->n + -1) {
          dVar3 = this->val[big._4_4_][big._4_4_];
          j = big._4_4_;
          while (j = j + 1, j < this->n) {
            this->val[j][big._4_4_] = (1.0 / dVar3) * this->val[j][big._4_4_];
          }
        }
      }
      free(__ptr);
      return true;
    }
    dum = 0.0;
    for (big._4_4_ = 0; big._4_4_ < this->n; big._4_4_ = big._4_4_ + 1) {
      if (dum < ABS(this->val[j][big._4_4_])) {
        dum = ABS(this->val[j][big._4_4_]);
      }
    }
    if ((dum == 0.0) && (!NAN(dum))) break;
    *(double *)((long)__ptr + (long)j * 8) = 1.0 / dum;
    j = j + 1;
  }
  free(__ptr);
  return false;
}

Assistant:

bool Matrix::lu(int32_t *idx, FLOAT &d, FLOAT eps) {
  
  if (m != n) {
    cerr << "ERROR: Trying to LU decompose a matrix of size (" << m << "x" << n << ")" << endl;
    exit(0);
  }
  
  int32_t i,imax,j,k;
  FLOAT   big,dum,sum,temp;
  FLOAT* vv = (FLOAT*)malloc(n*sizeof(FLOAT)); // vv stores the implicit scaling of each row.
  d = 1.0;
  for (i=0; i<n; i++) { // Loop over rows to get the implicit scaling information.
    big = 0.0;
    for (j=0; j<n; j++)
      if ((temp=fabs(val[i][j]))>big)
        big = temp;
    if (big == 0.0) { // No nonzero largest element.
      free(vv);
      return false;
    }
    vv[i] = 1.0/big; // Save the scaling.
  }
  for (j=0; j<n; j++) { // This is the loop over columns of Crout’s method.
    for (i=0; i<j; i++) { // This is equation (2.3.12) except for i = j.
      sum = val[i][j];
      for (k=0; k<i; k++)
        sum -= val[i][k]*val[k][j];
      val[i][j] = sum;
    }
    big = 0.0; // Initialize the search for largest pivot element.
    for (i=j; i<n; i++) {
      sum = val[i][j];
      for (k=0; k<j; k++)
        sum -= val[i][k]*val[k][j];
      val[i][j] = sum;
      if ( (dum=vv[i]*fabs(sum))>=big) {
        big  = dum;
        imax = i;
      }
    }
    if (j!=imax) { // Do we need to interchange rows?
      for (k=0; k<n; k++) { // Yes, do so...
        dum          = val[imax][k];
        val[imax][k] = val[j][k];
        val[j][k]    = dum;
      }
      d = -d;     // ...and change the parity of d.
      vv[imax]=vv[j]; // Also interchange the scale factor.
    }
    idx[j] = imax;
    if (j!=n-1) { // Now, finally, divide by the pivot element.
      dum = 1.0/val[j][j];
      for (i=j+1; i<n; i++)
        val[i][j] *= dum;
    }
  } // Go back for the next column in the reduction.
  
  // success
  free(vv);
  return true;
}